

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O0

int marshal_digest_algorithm(CBB *cbb,EVP_MD *md,bool with_null)

{
  bool bVar1;
  int iVar2;
  anon_struct_16_3_50f7b3fd *mdoid;
  anon_struct_16_3_50f7b3fd *__end1;
  anon_struct_16_3_50f7b3fd *__begin1;
  anon_struct_16_3_50f7b3fd (*__range1) [7];
  int nid;
  bool found;
  CBB null;
  CBB oid;
  CBB algorithm;
  bool with_null_local;
  EVP_MD *md_local;
  CBB *cbb_local;
  
  iVar2 = CBB_add_asn1(cbb,(CBB *)((long)&oid.u + 0x18),0x20000010);
  if ((iVar2 == 0) ||
     (iVar2 = CBB_add_asn1((CBB *)((long)&oid.u + 0x18),(CBB *)((long)&null.u + 0x18),6), iVar2 == 0
     )) {
    return 0;
  }
  bVar1 = false;
  iVar2 = EVP_MD_type((EVP_MD *)md);
  __end1 = kMDOIDs;
  do {
    if (__end1 == (anon_struct_16_3_50f7b3fd *)&switchD_001b52d5::switchdataD_0026a020) {
LAB_001b4575:
      if (!bVar1) {
        ERR_put_error(0x1d,0,0x66,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_extra.cc"
                      ,0xb4);
        return 0;
      }
      if (((!with_null) ||
          (iVar2 = CBB_add_asn1((CBB *)((long)&oid.u + 0x18),(CBB *)&nid,5), iVar2 != 0)) &&
         (iVar2 = CBB_flush(cbb), iVar2 != 0)) {
        return 1;
      }
      return 0;
    }
    if (iVar2 == __end1->nid) {
      iVar2 = CBB_add_bytes((CBB *)((long)&null.u + 0x18),__end1->oid,(ulong)__end1->oid_len);
      if (iVar2 == 0) {
        return 0;
      }
      bVar1 = true;
      goto LAB_001b4575;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

static int marshal_digest_algorithm(CBB *cbb, const EVP_MD *md,
                                    bool with_null) {
  CBB algorithm, oid, null;
  if (!CBB_add_asn1(cbb, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&algorithm, &oid, CBS_ASN1_OBJECT)) {
    return 0;
  }

  bool found = false;
  int nid = EVP_MD_type(md);
  for (const auto &mdoid : kMDOIDs) {
    if (nid == mdoid.nid) {
      if (!CBB_add_bytes(&oid, mdoid.oid, mdoid.oid_len)) {
        return 0;
      }
      found = true;
      break;
    }
  }

  if (!found) {
    OPENSSL_PUT_ERROR(DIGEST, DIGEST_R_UNKNOWN_HASH);
    return 0;
  }

  if ((with_null && !CBB_add_asn1(&algorithm, &null, CBS_ASN1_NULL)) ||  //
      !CBB_flush(cbb)) {
    return 0;
  }

  return 1;
}